

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O3

ParseDescriptorResponseStruct *
cfd::js::api::AddressStructApi::ParseDescriptor
          (ParseDescriptorResponseStruct *__return_storage_ptr__,
          ParseDescriptorRequestStruct *request)

{
  string *in_R8;
  undefined1 local_1f8 [32];
  _Any_data local_1d8;
  undefined1 local_1c8 [16];
  ParseDescriptorResponseStruct local_1b8;
  
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  local_1f8._0_8_ = 0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1f8._24_8_ =
       std::
       _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:167:20)>
       ::_M_invoke;
  local_1f8._16_8_ =
       std::
       _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_address.cpp:167:20)>
       ::_M_manager;
  local_1d8._M_unused._M_object = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"ParseDescriptor","");
  ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
            (&local_1b8,(api *)request,(ParseDescriptorRequestStruct *)local_1f8,
             (function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
              *)&local_1d8,in_R8);
  ParseDescriptorResponseStruct::operator=(__return_storage_ptr__,&local_1b8);
  ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct(&local_1b8);
  if ((undefined1 *)local_1d8._M_unused._0_8_ != local_1c8) {
    operator_delete(local_1d8._M_unused._M_object);
  }
  if ((code *)local_1f8._16_8_ != (code *)0x0) {
    (*(code *)local_1f8._16_8_)(local_1f8,local_1f8,3);
  }
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorResponseStruct AddressStructApi::ParseDescriptor(
    const ParseDescriptorRequestStruct& request) {
  auto call_func = [](const ParseDescriptorRequestStruct& request)
      -> ParseDescriptorResponseStruct {  // NOLINT
    NetType net_type = ConvertNetType(request.network);
    AddressFactory api(net_type);
    return AddressApiBase::ParseDescriptor(request, &api);
  };

  ParseDescriptorResponseStruct result;
  result = ExecuteStructApi<
      ParseDescriptorRequestStruct, ParseDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}